

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_STR_zri(DisasContext_conflict1 *s,arg_rri *a)

{
  _Bool _Var1;
  int len;
  uint32_t vofs;
  int off;
  int size;
  arg_rri *a_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    len = vec_full_reg_size(s);
    vofs = vec_full_reg_offset(s,a->rd);
    do_str(s,vofs,len,a->rn,a->imm * len);
  }
  return true;
}

Assistant:

static bool trans_STR_zri(DisasContext *s, arg_rri *a)
{
    if (sve_access_check(s)) {
        int size = vec_full_reg_size(s);
        int off = vec_full_reg_offset(s, a->rd);
        do_str(s, off, size, a->rn, a->imm * size);
    }
    return true;
}